

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O1

void Ssw_SmlNodeCopyFanin(Ssw_Sml_t *p,Aig_Obj_t *pObj,int iFrame)

{
  Aig_Obj_t *pAVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if (p->nFrames <= iFrame) {
    __assert_fail("iFrame < p->nFrames",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                  ,0x327,"void Ssw_SmlNodeCopyFanin(Ssw_Sml_t *, Aig_Obj_t *, int)");
  }
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                  ,0x328,"void Ssw_SmlNodeCopyFanin(Ssw_Sml_t *, Aig_Obj_t *, int)");
  }
  if ((*(uint *)&pObj->field_0x18 & 7) != 3) {
    __assert_fail("Aig_ObjIsCo(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                  ,0x329,"void Ssw_SmlNodeCopyFanin(Ssw_Sml_t *, Aig_Obj_t *, int)");
  }
  if ((iFrame != 0) && (p->nWordsTotal <= p->nWordsFrame)) {
    __assert_fail("iFrame == 0 || p->nWordsFrame < p->nWordsTotal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                  ,0x32a,"void Ssw_SmlNodeCopyFanin(Ssw_Sml_t *, Aig_Obj_t *, int)");
  }
  lVar3 = (long)(pObj->Id * p->nWordsTotal);
  lVar2 = (long)(iFrame * p->nWordsFrame);
  pAVar1 = pObj->pFanin0;
  lVar4 = (long)(p->nWordsTotal * *(int *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x24));
  if ((pAVar1 == (Aig_Obj_t *)0x0) ||
     ((((uint)pAVar1 ^ *(uint *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x18) >> 3) & 1) != 0)) {
    if (0 < p->nWordsFrame) {
      lVar2 = lVar2 * 4;
      lVar5 = 0;
      do {
        *(uint *)((long)&p[1].pAig + lVar5 * 4 + lVar2 + lVar3 * 4) =
             ~*(uint *)((long)&p[1].pAig + lVar5 * 4 + lVar2 + lVar4 * 4);
        lVar5 = lVar5 + 1;
      } while (lVar5 < p->nWordsFrame);
    }
  }
  else if (0 < p->nWordsFrame) {
    lVar2 = lVar2 * 4;
    lVar5 = 0;
    do {
      *(undefined4 *)((long)&p[1].pAig + lVar5 * 4 + lVar2 + lVar3 * 4) =
           *(undefined4 *)((long)&p[1].pAig + lVar5 * 4 + lVar2 + lVar4 * 4);
      lVar5 = lVar5 + 1;
    } while (lVar5 < p->nWordsFrame);
  }
  return;
}

Assistant:

void Ssw_SmlNodeCopyFanin( Ssw_Sml_t * p, Aig_Obj_t * pObj, int iFrame )
{
    unsigned * pSims, * pSims0;
    int fCompl, fCompl0, i;
    assert( iFrame < p->nFrames );
    assert( !Aig_IsComplement(pObj) );
    assert( Aig_ObjIsCo(pObj) );
    assert( iFrame == 0 || p->nWordsFrame < p->nWordsTotal );
    // get hold of the simulation information
    pSims  = Ssw_ObjSim(p, pObj->Id) + p->nWordsFrame * iFrame;
    pSims0 = Ssw_ObjSim(p, Aig_ObjFanin0(pObj)->Id) + p->nWordsFrame * iFrame;
    // get complemented attributes of the children using their random info
    fCompl  = pObj->fPhase;
    fCompl0 = Aig_ObjPhaseReal(Aig_ObjChild0(pObj));
    // copy information as it is
    if ( fCompl0 )
        for ( i = 0; i < p->nWordsFrame; i++ )
            pSims[i] = ~pSims0[i];
    else
        for ( i = 0; i < p->nWordsFrame; i++ )
            pSims[i] = pSims0[i];
}